

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FabArray(FabArray<amrex::FArrayBox> *this,Arena *a)

{
  FabArrayStats *in_RSI;
  undefined8 *in_RDI;
  FabArrayBase *unaff_retaddr;
  
  FabArrayBase::FabArrayBase(unaff_retaddr);
  *in_RDI = &PTR__FabArray_018019b8;
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              *)in_RSI);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f),(Arena *)in_RSI);
  *(undefined1 *)(in_RDI + 0x20) = 0;
  std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::vector
            ((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)0xfeeb98);
  in_RDI[0x24] = 0;
  MultiArray4<double>::MultiArray4((MultiArray4<double> *)(in_RDI + 0x25));
  MultiArray4<const_double>::MultiArray4((MultiArray4<const_double> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xfeebd3);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::
  unique_ptr<amrex::FBData<amrex::FArrayBox>,std::default_delete<amrex::FBData<amrex::FArrayBox>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
              *)in_RSI);
  std::
  unique_ptr<amrex::PCData<amrex::FArrayBox>,std::default_delete<amrex::PCData<amrex::FArrayBox>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              *)in_RSI);
  std::
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,std::default_delete<amrex::FabArray<amrex::FArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
              *)in_RSI);
  FabArrayBase::FabArrayStats::recordBuild(in_RSI);
  return;
}

Assistant:

FabArray<FAB>::FabArray (Arena* a) noexcept
    : m_dallocator(a),
      shmem()
{
    m_FA_stats.recordBuild();
}